

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::MessageBuilder::SegmentInit>::dispose
          (Array<capnp::MessageBuilder::SegmentInit> *this)

{
  SegmentInit *firstElement;
  size_t elementCount;
  size_t sizeCopy;
  SegmentInit *ptrCopy;
  Array<capnp::MessageBuilder::SegmentInit> *this_local;
  
  firstElement = this->ptr;
  elementCount = this->size_;
  if (firstElement != (SegmentInit *)0x0) {
    this->ptr = (SegmentInit *)0x0;
    this->size_ = 0;
    ArrayDisposer::dispose<capnp::MessageBuilder::SegmentInit>
              (this->disposer,firstElement,elementCount,elementCount);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }